

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O0

void __thiscall
cali::CompressedSnapshotRecord::CompressedSnapshotRecord
          (CompressedSnapshotRecord *this,size_t len,uchar *buf)

{
  uchar *buf_local;
  size_t len_local;
  CompressedSnapshotRecord *this_local;
  
  this->m_buffer = buf;
  this->m_buffer_len = len;
  this->m_num_nodes = 0;
  this->m_num_imm = 0;
  this->m_imm_pos = 1;
  this->m_imm_len = 1;
  this->m_needed_len = 2;
  this->m_skipped = 0;
  memset(this->m_buffer,0,this->m_buffer_len);
  return;
}

Assistant:

CompressedSnapshotRecord::CompressedSnapshotRecord(size_t len, unsigned char* buf)
    : m_buffer(buf),
      m_buffer_len(len),
      m_num_nodes(0),
      m_num_imm(0),
      m_imm_pos(1),
      m_imm_len(1),
      m_needed_len(2),
      m_skipped(0)
{
    memset(m_buffer, 0, m_buffer_len);
}